

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O3

void do_snare(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  ROOM_INDEX_DATA *pRVar3;
  char *txt;
  AFFECT_DATA snaretimer;
  ROOM_AFFECT_DATA RStack_e8;
  AFFECT_DATA local_98;
  
  iVar2 = get_skill(ch,(int)gsn_snare);
  if (iVar2 < 5) {
    txt = "You lay some sticks down in a threatening snare to anyone under an inch tall.\n\r";
    goto LAB_002d51b4;
  }
  bVar1 = is_affected(ch,(int)gsn_snaretimer);
  if (bVar1) {
    txt = "You do not feel ready to lay a new snare yet.\n\r";
    goto LAB_002d51b4;
  }
  bVar1 = is_affected_room(ch->in_room,(int)gsn_snare);
  if (bVar1) {
    txt = "There is already a snare here.\n\r";
    goto LAB_002d51b4;
  }
  pRVar3 = ch->in_room;
  if (((ushort)pRVar3->sector_type - 2 < 4) || (pRVar3->sector_type == 10)) {
LAB_002d5198:
    if ((pRVar3->vnum != 0x1644) && (pRVar3->cabal == 0)) {
      init_affect_room(&RStack_e8);
      RStack_e8.where = 0;
      RStack_e8.aftype = 1;
      RStack_e8.type = gsn_snare;
      RStack_e8.level = ch->level;
      RStack_e8.duration = 0x18;
      RStack_e8.location = 0;
      RStack_e8.modifier = 0;
      RStack_e8.tick_fun = (RAFF_FUN *)0x0;
      RStack_e8.end_fun = (RAFF_FUN *)0x0;
      RStack_e8.owner = ch;
      new_affect_to_room(ch->in_room,&RStack_e8);
      init_affect(&local_98);
      local_98.where = 0;
      local_98.type = gsn_snaretimer;
      local_98.level = ch->level;
      local_98.duration = 0x18;
      local_98.location = 0;
      local_98.modifier = 0;
      local_98.aftype = 5;
      affect_to_char(ch,&local_98);
      send_to_char("You lay down vines and plants in a cunningly concealed snare to trap the unwary.\n\r"
                   ,ch);
      act("$n lays down vines and plants in a cunningly concealed snare to trap the unwary.\n\r",ch,
          (void *)0x0,(void *)0x0,0);
      WAIT_STATE(ch,0x30);
      return;
    }
  }
  else {
    bVar1 = is_immortal(ch);
    if (bVar1) {
      pRVar3 = ch->in_room;
      goto LAB_002d5198;
    }
  }
  txt = "You cannot create a snare in this environment.\n\r";
LAB_002d51b4:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_snare(CHAR_DATA *ch, char *argument)
{
	ROOM_AFFECT_DATA af;
	AFFECT_DATA snaretimer;

	if (get_skill(ch, gsn_snare) < 5)
	{
		send_to_char("You lay some sticks down in a threatening snare to anyone under an inch tall.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_snaretimer))
	{
		send_to_char("You do not feel ready to lay a new snare yet.\n\r", ch);
		return;
	}

	if (is_affected_room(ch->in_room, gsn_snare))
	{
		send_to_char("There is already a snare here.\n\r", ch);
		return;
	}

	if ((ch->in_room->sector_type != SECT_FOREST
			&& ch->in_room->sector_type != SECT_MOUNTAIN
			&& ch->in_room->sector_type != SECT_DESERT
			&& ch->in_room->sector_type != SECT_FIELD
			&& ch->in_room->sector_type != SECT_HILLS
			&& !is_immortal(ch))
		|| (ch->in_room->vnum == 5700 || ch->in_room->cabal))
	{
		send_to_char("You cannot create a snare in this environment.\n\r", ch);
		return;
	}

	init_affect_room(&af);
	af.where = TO_ROOM_AFFECTS;
	af.aftype = AFT_SKILL;
	af.type = gsn_snare;
	af.level = ch->level;
	af.duration = 24;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.owner = ch;
	af.end_fun = nullptr;
	af.tick_fun = nullptr;
	new_affect_to_room(ch->in_room, &af);

	init_affect(&snaretimer);
	snaretimer.where = TO_AFFECTS;
	snaretimer.type = gsn_snaretimer;
	snaretimer.level = ch->level;
	snaretimer.duration = 24;
	snaretimer.location = APPLY_NONE;
	snaretimer.modifier = 0;
	snaretimer.aftype = AFT_INVIS;
	affect_to_char(ch, &snaretimer);

	send_to_char("You lay down vines and plants in a cunningly concealed snare to trap the unwary.\n\r", ch);
	act("$n lays down vines and plants in a cunningly concealed snare to trap the unwary.\n\r", ch, 0, 0, TO_ROOM);

	WAIT_STATE(ch, PULSE_VIOLENCE * 4);
}